

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O3

olsrv2_lan_entry *
olsrv2_lan_add(nhdp_domain *domain,os_route_key *prefix,uint32_t metric,uint8_t distance)

{
  char cVar1;
  int iVar2;
  avl_node *paVar3;
  void *pvVar4;
  avl_node *paVar5;
  olsrv2_lan_entry *poVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  
  paVar5 = avl_find(&_lan_tree,prefix);
  if (paVar5 == (avl_node *)0x0) {
    poVar6 = (olsrv2_lan_entry *)oonf_class_malloc(&_lan_class);
    if (poVar6 == (olsrv2_lan_entry *)0x0) {
      return (olsrv2_lan_entry *)0x0;
    }
    *(undefined4 *)((poVar6->prefix).src._addr + 0xe) = *(undefined4 *)((prefix->src)._addr + 0xe);
    paVar5 = *(avl_node **)(prefix->dst)._addr;
    paVar3 = *(avl_node **)((prefix->dst)._addr + 8);
    pvVar4 = *(void **)((prefix->src)._addr + 6);
    *(avl_node **)&(poVar6->prefix).dst._type = *(avl_node **)&(prefix->dst)._type;
    *(void **)((poVar6->prefix).src._addr + 6) = pvVar4;
    *(avl_node **)(poVar6->prefix).dst._addr = paVar5;
    *(avl_node **)((long)(poVar6->prefix).dst._addr + 8) = paVar3;
    (poVar6->_node).key = poVar6;
    avl_insert(&_lan_tree,&poVar6->_node);
    poVar6->same_distance = true;
    lVar7 = 100;
    do {
      *(undefined4 *)((long)(poVar6->prefix).dst._addr + lVar7) = 0xffffff;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x84);
  }
  else {
    poVar6 = (olsrv2_lan_entry *)&paVar5[-1].parent;
  }
  iVar2 = domain->index;
  poVar6->_domaindata[iVar2].outgoing_metric = metric;
  poVar6->_domaindata[iVar2].distance = distance;
  poVar6->_domaindata[iVar2].active = true;
  olsrv2_routing_domain_changed(domain,true);
  poVar6->same_distance = true;
  lVar7 = 0xd;
  cVar8 = '\0';
  while ((*(char *)((long)(poVar6->prefix).dst._addr + lVar7 * 8 + 1) != '\x01' ||
         (bVar9 = cVar8 == '\0', cVar1 = *(char *)((long)(poVar6->prefix).dst._addr + lVar7 * 8),
         bVar10 = cVar8 == cVar1, cVar8 = cVar1, bVar10 || bVar9))) {
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x11) {
      return poVar6;
    }
  }
  poVar6->same_distance = false;
  return poVar6;
}

Assistant:

struct olsrv2_lan_entry *
olsrv2_lan_add(struct nhdp_domain *domain, const struct os_route_key *prefix, uint32_t metric, uint8_t distance) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  uint8_t tmp_dist;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (entry == NULL) {
    entry = oonf_class_malloc(&_lan_class);
    if (entry == NULL) {
      return NULL;
    }

    /* copy key and append to tree */
    memcpy(&entry->prefix, prefix, sizeof(*prefix));
    entry->_node.key = &entry->prefix;
    avl_insert(&_lan_tree, &entry->_node);

    entry->same_distance = true;

    /* initialize linkcost */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      entry->_domaindata[i].outgoing_metric = RFC7181_METRIC_INFINITE;
    }
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->outgoing_metric = metric;
  lan_data->distance = distance;
  lan_data->active = true;
  olsrv2_routing_domain_changed(domain, true);

  tmp_dist = 0;
  entry->same_distance = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lan_data = &entry->_domaindata[i];
    if (lan_data->active) {
      if (tmp_dist == 0) {
        /* copy first valid distance */
        tmp_dist = lan_data->distance;
      }
      if (tmp_dist != lan_data->distance) {
        /* we found a difference */
        entry->same_distance = false;
        break;
      }
    }
  }
  return entry;
}